

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

int fire_damage(obj *chain,boolean force,boolean here,xchar x,xchar y)

{
  short sVar1;
  obj *poVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  bool bVar9;
  char *local_98;
  char *local_80;
  char *local_70;
  obj *local_50;
  int dindx;
  int in_sight;
  int retval;
  obj *ncobj;
  obj *nobj;
  obj *otmp;
  obj *obj;
  int chance;
  xchar y_local;
  xchar x_local;
  boolean here_local;
  boolean force_local;
  obj *chain_local;
  
  dindx = 0;
  otmp = chain;
  if (((u.uprops[0x1e].intrinsic == 0) &&
      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
     ((bVar9 = false, ublindf != (obj *)0x0 && (bVar9 = false, ublindf->oartifact == '\x1d')))) {
    bVar9 = (viz_array[y][x] & 1U) != 0;
  }
  do {
    if (otmp == (obj *)0x0) {
      if ((dindx != 0) && (!bVar9)) {
        pline("You smell smoke.");
      }
      return dindx;
    }
    if (here == '\0') {
      local_50 = otmp->nobj;
    }
    else {
      local_50 = (otmp->v).v_nexthere;
    }
    bVar3 = catch_lit(otmp);
    if (bVar3 == '\0') {
      if ((otmp->otyp < 0xda) || (0xe1 < otmp->otyp)) {
        if ((force != '\0') ||
           (iVar4 = (int)u.uluck, iVar8 = (int)u.moreluck, iVar5 = rn2(0x14),
           iVar4 + iVar8 + 5 <= iVar5)) {
          if ((otmp->oclass == '\t') || (otmp->oclass == '\n')) {
            if ((otmp->otyp != 0x162) && (otmp->otyp != 0x17f)) {
              if (otmp->otyp == 0x1bd) {
                if (bVar9) {
                  pcVar6 = xname(otmp);
                  pcVar6 = the(pcVar6);
                  pline("Smoke rises from %s.",pcVar6);
                }
              }
              else {
                iVar4 = 3;
                if (otmp->oclass == '\t') {
                  iVar4 = 2;
                }
                if (bVar9) {
                  pcVar6 = Yname2(otmp);
                  if (otmp->quan < 2) {
                    local_70 = destroy_strings[iVar4 * 3];
                  }
                  else {
                    local_70 = destroy_strings[iVar4 * 3 + 1];
                  }
                  pline("%s %s.",pcVar6,local_70);
                }
                delobj(otmp);
                dindx = dindx + 1;
              }
            }
          }
          else if (otmp->oclass == '\b') {
            if (bVar9) {
              pcVar6 = Yname2(otmp);
              if (otmp->quan < 2) {
                local_80 = "boils and explodes";
              }
              else {
                local_80 = "boil and explode";
              }
              pline("%s %s.",pcVar6,local_80);
            }
            delobj(otmp);
            dindx = dindx + 1;
          }
          else {
            bVar3 = is_flammable(otmp);
            if ((((bVar3 != '\0') && ((*(uint *)&otmp->field_0x4a >> 8 & 3) < 3)) &&
                ((*(uint *)&otmp->field_0x4a >> 0xc & 1) == 0)) &&
               (((*(uint *)&otmp->field_0x4a >> 1 & 1) == 0 || (iVar4 = rnl(4), iVar4 != 0)))) {
              if (bVar9) {
                pcVar6 = Yname2(otmp);
                pcVar7 = otense(otmp,"burn");
                if ((*(uint *)&otmp->field_0x4a >> 8 & 3) == 2) {
                  local_98 = " completely";
                }
                else {
                  local_98 = "";
                  if ((*(uint *)&otmp->field_0x4a >> 8 & 3) != 0) {
                    local_98 = " further";
                  }
                }
                pline("%s %s%s.",pcVar6,pcVar7,local_98);
              }
              *(uint *)&otmp->field_0x4a =
                   *(uint *)&otmp->field_0x4a & 0xfffffcff |
                   ((*(uint *)&otmp->field_0x4a >> 8 & 3) + 1 & 3) << 8;
            }
          }
        }
      }
      else {
        sVar1 = otmp->otyp;
        if (sVar1 == 0xda) {
          obj._0_4_ = 0x1e;
        }
        else if (sVar1 == 0xdb) {
          obj._0_4_ = 0x28;
        }
        else {
          if (sVar1 == 0xdc || sVar1 == 0xdd) goto LAB_003125de;
          obj._0_4_ = 0x14;
        }
        if ((force != '\0') ||
           (iVar4 = (int)u.uluck, iVar8 = (int)u.moreluck, iVar5 = rn2((int)obj),
           iVar4 + iVar8 + 5 <= iVar5)) {
          if (bVar9) {
            pcVar6 = Yname2(otmp);
            pline("%s catches fire and burns.",pcVar6);
          }
          if (otmp->cobj != (obj *)0x0) {
            if (bVar9) {
              pline("Its contents fall out.");
            }
            poVar2 = otmp->cobj;
            while (nobj = poVar2, nobj != (obj *)0x0) {
              poVar2 = nobj->nobj;
              obj_extract_self(nobj);
              bVar3 = flooreffects(nobj,(int)x,(int)y,"");
              if (bVar3 == '\0') {
                place_object(nobj,level,(int)x,(int)y);
              }
            }
          }
          delobj(otmp);
          dindx = dindx + 1;
        }
      }
    }
LAB_003125de:
    otmp = local_50;
  } while( true );
}

Assistant:

int fire_damage(struct obj *chain, boolean force, boolean here, xchar x, xchar y)
{
    int chance;
    struct obj *obj, *otmp, *nobj, *ncobj;
    int retval = 0;
    int in_sight = !Blind && couldsee(x, y);	/* Don't care if it's lit */
    int dindx;

    for (obj = chain; obj; obj = nobj) {
	nobj = here ? obj->nexthere : obj->nobj;

	/* object might light in a controlled manner */
	if (catch_lit(obj))
	    continue;

	if (Is_container(obj)) {
	    switch (obj->otyp) {
	    case ICE_BOX:
	    case IRON_SAFE:
		continue;		/* Immune */
		/*NOTREACHED*/
		break;
	    case CHEST:
		chance = 40;
		break;
	    case LARGE_BOX:
		chance = 30;
		break;
	    default:
		chance = 20;
		break;
	    }
	    if (!force && (Luck + 5) > rn2(chance))
		continue;
	    /* Container is burnt up - dump contents out */
	    if (in_sight) pline("%s catches fire and burns.", Yname2(obj));
	    if (Has_contents(obj)) {
		if (in_sight) pline("Its contents fall out.");
		for (otmp = obj->cobj; otmp; otmp = ncobj) {
		    ncobj = otmp->nobj;
		    obj_extract_self(otmp);
		    if (!flooreffects(otmp, x, y, ""))
			place_object(otmp, level, x, y);
		}
	    }
	    delobj(obj);
	    retval++;
	} else if (!force && (Luck + 5) > rn2(20)) {
	    /*  chance per item of sustaining damage:
	     *	max luck (full moon):	 5%
	     *	max luck (elsewhen):	10%
	     *	avg luck (Luck==0):	75%
	     *	awful luck (Luck<-4):  100%
	     */
	    continue;
	} else if (obj->oclass == SCROLL_CLASS || obj->oclass == SPBOOK_CLASS) {
	    if (obj->otyp == SCR_FIRE || obj->otyp == SPE_FIREBALL)
		continue;
	    if (obj->otyp == SPE_BOOK_OF_THE_DEAD) {
		if (in_sight) pline("Smoke rises from %s.", the(xname(obj)));
		continue;
	    }
	    dindx = (obj->oclass == SCROLL_CLASS) ? 2 : 3;
	    if (in_sight)
		pline("%s %s.", Yname2(obj), (obj->quan > 1) ?
		      destroy_strings[dindx*3 + 1] : destroy_strings[dindx*3]);
	    delobj(obj);
	    retval++;
	} else if (obj->oclass == POTION_CLASS) {
	    dindx = 1;
	    if (in_sight)
		pline("%s %s.", Yname2(obj), (obj->quan > 1) ?
		      destroy_strings[dindx*3 + 1] : destroy_strings[dindx*3]);
	    delobj(obj);
	    retval++;
	} else if (is_flammable(obj) && obj->oeroded < MAX_ERODE &&
		   !(obj->oerodeproof || (obj->blessed && !rnl(4)))) {
	    if (in_sight) {
		pline("%s %s%s.", Yname2(obj), otense(obj, "burn"),
		      obj->oeroded+1 == MAX_ERODE ? " completely" :
		      obj->oeroded ? " further" : "");
	    }
	    obj->oeroded++;
	}
    }

    if (retval && !in_sight)
	pline("You smell smoke.");
    return retval;
}